

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

string * __thiscall
ast::Identifier::toString_abi_cxx11_(string *__return_storage_ptr__,Identifier *this)

{
  ostringstream local_190 [8];
  ostringstream msg;
  Identifier *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,(string *)&(this->tok).Literal);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::Identifier::toString() const {
    std::ostringstream msg;
    msg << tok.Literal;
    return msg.str();
}